

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O3

void Ssc_ManStartSolver(Ssc_Man_t *p)

{
  uint uVar1;
  uint *puVar2;
  Gia_Man_t *pGVar3;
  int *piVar4;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Int_t *pVVar5;
  uint *__s;
  int *__s_00;
  sat_solver *s;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iObj;
  long lVar9;
  uint uVar10;
  int iVar11;
  
  pAig = Gia_ManToAigSimple(p->pFraig);
  p_00 = Cnf_Derive(pAig,0);
  if ((p->pSat != (sat_solver *)0x0) || (p->vId2Var != (Vec_Int_t *)0x0)) {
    __assert_fail("p->pSat == NULL && p->vId2Var == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscSat.c"
                  ,0x10c,"void Ssc_ManStartSolver(Ssc_Man_t *)");
  }
  if (pAig->vObjs->nSize != p->pFraig->nObjs) {
    __assert_fail("Aig_ManObjNumMax(pMan) == Gia_ManObjNum(p->pFraig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscSat.c"
                  ,0x10d,"void Ssc_ManStartSolver(Ssc_Man_t *)");
  }
  Aig_ManStop(pAig);
  iVar6 = p_00->nVars;
  p->nSatVars = iVar6;
  p->nSatVarsPivot = iVar6;
  iVar6 = p->pAig->nObjs - p->pAig->vCos->nSize;
  iVar11 = p->pCare->nObjs - p->pCare->vCos->nSize;
  uVar10 = iVar11 + iVar6 + 8;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < iVar11 + iVar6 + 7U) {
    uVar7 = uVar10;
  }
  pVVar5->nCap = uVar7;
  if (uVar7 == 0) {
    __s = (uint *)0x0;
  }
  else {
    __s = (uint *)malloc((long)(int)uVar7 * 4);
  }
  pVVar5->pArray = (int *)__s;
  pVVar5->nSize = uVar10;
  __s_00 = (int *)0x0;
  memset(__s,0,(long)(int)uVar10 << 2);
  p->vId2Var = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = uVar7;
  if (uVar7 != 0) {
    __s_00 = (int *)malloc((long)(int)uVar7 << 2);
  }
  pVVar5->pArray = __s_00;
  pVVar5->nSize = uVar10;
  memset(__s_00,0,(long)(int)uVar10 << 2);
  p->vVar2Id = pVVar5;
  if (0 < (int)uVar10) {
    puVar2 = (uint *)p_00->pVarNums;
    uVar7 = *puVar2;
    *__s = uVar7;
    if (uVar7 < uVar10) {
      __s_00[uVar7] = 0;
      pGVar3 = p->pFraig;
      pVVar5 = pGVar3->vCis;
      if (0 < pVVar5->nSize) {
        piVar4 = pVVar5->pArray;
        lVar8 = 0;
        do {
          uVar7 = piVar4[lVar8];
          lVar9 = (long)(int)uVar7;
          if ((lVar9 < 0) || (pGVar3->nObjs <= (int)uVar7)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar10 <= uVar7) goto LAB_005befd8;
          uVar1 = puVar2[lVar9];
          __s[lVar9] = uVar1;
          if (((int)uVar1 < 0) || (uVar10 <= uVar1)) goto LAB_005befd8;
          __s_00[uVar1] = uVar7;
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar5->nSize);
      }
      s = sat_solver_new();
      sat_solver_setnvars(s,p_00->nVars + 1000);
      lVar8 = 0;
      do {
        if (p_00->nClauses <= lVar8) {
          Cnf_DataFree(p_00);
          iVar6 = sat_solver_simplify(s);
          if (iVar6 != 0) {
            p->pSat = s;
            return;
          }
          goto LAB_005befc2;
        }
        iVar6 = sat_solver_addclause(s,p_00->pClauses[lVar8],p_00->pClauses[lVar8 + 1]);
        lVar8 = lVar8 + 1;
      } while (iVar6 != 0);
      Cnf_DataFree(p_00);
LAB_005befc2:
      sat_solver_delete(s);
      return;
    }
  }
LAB_005befd8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Ssc_ManStartSolver( Ssc_Man_t * p )
{
    Aig_Man_t * pMan = Gia_ManToAigSimple( p->pFraig );
    Cnf_Dat_t * pDat = Cnf_Derive( pMan, 0 );
    Gia_Obj_t * pObj;
    sat_solver * pSat;
    int i, status;
    assert( p->pSat == NULL && p->vId2Var == NULL );
    assert( Aig_ManObjNumMax(pMan) == Gia_ManObjNum(p->pFraig) );
    Aig_ManStop( pMan );
    // save variable mapping
    p->nSatVarsPivot = p->nSatVars = pDat->nVars;
    p->vId2Var = Vec_IntStart( Gia_ManCandNum(p->pAig) + Gia_ManCandNum(p->pCare) + 10 ); // mapping of each node into its SAT var
    p->vVar2Id = Vec_IntStart( Gia_ManCandNum(p->pAig) + Gia_ManCandNum(p->pCare) + 10 ); // mapping of each SAT var into its node
    Ssc_ObjSetSatVar( p, 0, pDat->pVarNums[0] );
    Gia_ManForEachCi( p->pFraig, pObj, i )
    {
        int iObj = Gia_ObjId( p->pFraig, pObj );
        Ssc_ObjSetSatVar( p, iObj, pDat->pVarNums[iObj] );
    }
//Cnf_DataWriteIntoFile( pDat, "dump.cnf", 1, NULL, NULL );
    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pDat->nVars + 1000 );
    for ( i = 0; i < pDat->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pDat->pClauses[i], pDat->pClauses[i+1] ) )
        {
            Cnf_DataFree( pDat );
            sat_solver_delete( pSat );
            return;
        }
    }
    Cnf_DataFree( pDat );
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        return;
    }
    p->pSat = pSat;
}